

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

void __thiscall
ghc::filesystem::path::path<char[3],ghc::filesystem::path>(path *this,char (*source) [3],format fmt)

{
  detail::toUtf8<char>(&this->_path,*source);
  postprocess_path_with_format(this,fmt);
  return;
}

Assistant:

_path(detail::toWChar(source))
#else
    : _path(detail::toUtf8(source))
#endif
{
    postprocess_path_with_format(fmt);
}